

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_json_reader.c
# Opt level: O2

uint8_t * dtl_json_reader_lstrip(dtl_json_reader_t *self,uint8_t *pBegin,uint8_t *pEnd)

{
  byte bVar1;
  int iVar2;
  
  while( true ) {
    if (pEnd <= pBegin) {
      return pBegin;
    }
    bVar1 = *pBegin;
    iVar2 = bstr_pred_is_whitespace((uint)bVar1);
    if (iVar2 == 0) break;
    if (bVar1 == 10) {
      self->lineNumber = self->lineNumber + 1;
    }
    pBegin = pBegin + 1;
  }
  return pBegin;
}

Assistant:

static const uint8_t *dtl_json_reader_lstrip(dtl_json_reader_t *self, const uint8_t *pBegin, const uint8_t *pEnd)
{
   const uint8_t *pNext = pBegin;
   while (pNext < pEnd)
   {
      int c = (int) *pNext;
      if (!bstr_pred_is_whitespace(c)){
         break;
      }
      if (c == '\n')
      {
         self->lineNumber++;
      }
      pNext++;
   }
   return pNext;
}